

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_set.cpp
# Opt level: O3

unique_ptr<duckdb::SetStatement,_std::default_delete<duckdb::SetStatement>,_true> __thiscall
duckdb::Transformer::TransformResetVariable(Transformer *this,PGVariableSetStmt *stmt)

{
  SetScope scope_p;
  Transformer *this_00;
  NotImplementedException *this_01;
  long in_RDX;
  string name;
  string local_60;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  if (*(int *)(in_RDX + 8) != 0) {
    ::std::__cxx11::string::string
              ((string *)&local_40,*(char **)(in_RDX + 0x10),(allocator *)&local_60);
    scope_p = anon_unknown_473::ToSetScope(*(VariableSetScope *)(in_RDX + 8));
    this_00 = (Transformer *)operator_new(0xa0);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    ::std::__cxx11::string::_M_construct<char*>((string *)&local_60,local_40,local_40 + local_38);
    ResetVariableStatement::ResetVariableStatement
              ((ResetVariableStatement *)this_00,&local_60,scope_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    (this->parent).ptr = this_00;
    if (local_40 != local_30) {
      operator_delete(local_40);
    }
    return (unique_ptr<duckdb::SetStatement,_std::default_delete<duckdb::SetStatement>_>)
           (unique_ptr<duckdb::SetStatement,_std::default_delete<duckdb::SetStatement>_>)this;
  }
  this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"RESET LOCAL is not implemented.","");
  NotImplementedException::NotImplementedException(this_01,&local_60);
  __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<SetStatement> Transformer::TransformResetVariable(duckdb_libpgquery::PGVariableSetStmt &stmt) {
	D_ASSERT(stmt.kind == duckdb_libpgquery::VariableSetKind::VAR_RESET);

	if (stmt.scope == duckdb_libpgquery::VariableSetScope::VAR_SET_SCOPE_LOCAL) {
		throw NotImplementedException("RESET LOCAL is not implemented.");
	}

	string name(stmt.name);
	D_ASSERT(!name.empty()); // parser protect us!

	return make_uniq<ResetVariableStatement>(name, ToSetScope(stmt.scope));
}